

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void add_linear_comb_weighted<float,long,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *res,float *Xc,
               long *Xc_ind,long *Xc_indptr,double *coef,double x_sd,double x_mean,double *fill_val,
               MissingAction missing_action,double *buffer_arr,size_t *buffer_NAs,bool first_run,
               vector<double,_std::allocator<double>_> *w)

{
  undefined1 auVar1 [16];
  pointer __first;
  pointer __last;
  ulong uVar2;
  pointer pdVar3;
  size_t sVar4;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  size_type __n;
  size_type __n_00;
  longdouble lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  allocator_type local_101;
  longdouble local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  vector<double,_std::allocator<double>_> denseX;
  
  if (missing_action == Fail || !first_run) {
    add_linear_comb<float,long>
              (ix_arr,st,end,col_num,res,Xc,Xc_ind,Xc_indptr,coef,x_sd,x_mean,fill_val,
               missing_action,buffer_arr,buffer_NAs,first_run);
    return;
  }
  local_100 = (longdouble)CONCAT28(local_100._8_2_,w);
  __n = (end - st) + 1;
  obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&denseX,__n,(value_type_conflict *)&obs_weight,(allocator_type *)&sorted_ix);
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,
                      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&obs_weight,__n,(allocator_type *)&sorted_ix)
  ;
  if (st <= end) {
    lVar6 = *local_100._0_8_;
    pdVar3 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = st;
    do {
      *pdVar3 = *(double *)(lVar6 + ix_arr[sVar4] * 8);
      sVar4 = sVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (sVar4 <= end);
  }
  __n_00 = __n;
  if (__n != 0) {
    sVar5 = 0;
    do {
      dVar9 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar5];
      if (0x7fefffffffffffff < (ulong)ABS(dVar9)) {
        denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar5] =
             denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[__n_00 - 1];
        denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[__n_00 - 1] = dVar9;
        dVar9 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5];
        obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5] =
             obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[__n_00 - 1];
        obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[__n_00 - 1] = dVar9;
        __n_00 = __n_00 - 1;
      }
      sVar5 = sVar5 + 1;
    } while (__n != sVar5);
  }
  local_100 = (longdouble)0;
  if (__n_00 != 0) {
    lVar8 = (longdouble)0;
    lVar6 = 0;
    do {
      lVar8 = lVar8 + (longdouble)
                      *(double *)
                       ((long)obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar6);
      lVar6 = lVar6 + 8;
    } while (__n_00 * 8 - lVar6 != 0);
    local_100 = lVar8 * (longdouble)0.5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&sorted_ix,__n_00,&local_101);
  __last = sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar1 = _DAT_0036b1f0;
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar2 = ((long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) - 8;
    auVar12._8_4_ = (int)uVar2;
    auVar12._0_8_ = uVar2;
    auVar12._12_4_ = (int)(uVar2 >> 0x20);
    auVar10._0_8_ = uVar2 >> 3;
    auVar10._8_8_ = auVar12._8_8_ >> 3;
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_0036b1f0;
    auVar11 = _DAT_0036b1e0;
    do {
      auVar12 = auVar11 ^ auVar1;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = uVar7;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar6 + 2;
    } while (((uVar2 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar2 = (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar6 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,long,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,float_const*,long_const*,long_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:906:19)>
                  )&denseX);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,long,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,float_const*,long_const*,long_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )__first,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:906:19)>
                           )&denseX);
    }
  }
  *fill_val = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]];
  if (__n_00 != 0) {
    lVar8 = (longdouble)0;
    uVar2 = 0;
    do {
      lVar8 = lVar8 + (longdouble)
                      obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar2]];
      if (local_100 <= lVar8) {
        dVar9 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar2]];
        if (((lVar8 == local_100) && (!NAN(lVar8) && !NAN(local_100))) && (uVar2 < __n_00 - 1)) {
          dVar9 = dVar9 + (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [sorted_ix.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar2 + 1]] - dVar9) * 0.5;
        }
        *fill_val = dVar9;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (__n_00 != uVar2);
  }
  *fill_val = (*coef / x_sd) * (*fill_val - x_mean);
  if (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  add_linear_comb<float,long>
            (ix_arr,st,end,col_num,res,Xc,Xc_ind,Xc_indptr,coef,x_sd,x_mean,fill_val,missing_action,
             buffer_arr,buffer_NAs,false);
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sorted_ix.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sorted_ix.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t *restrict ix_arr, size_t st, size_t end, size_t col_num, double *restrict res,
                              const real_t_ *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                              double &restrict coef, double x_sd, double x_mean, double &restrict fill_val, MissingAction missing_action,
                              double *restrict buffer_arr, size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: there's likely a better way of doing this directly with sparse inputs.
       Think about some way of doing it efficiently. */
    if (first_run && missing_action != Fail)
    {
        std::vector<double> denseX(end-st+1, 0.);
        todense(ix_arr, st, end,
                col_num, Xc, Xc_ind, Xc_indptr,
                denseX.data());
        std::vector<double> obs_weight(end-st+1);
        for (size_t row = st; row <= end; row++)
            obs_weight[row - st] = w[ix_arr[row]];

        size_t end_new = end - st + 1;
        for (size_t ix = 0; ix < end-st+1; ix++)
        {
            if (unlikely(is_na_or_inf(denseX[ix])))
            {
                std::swap(denseX[ix], denseX[--end_new]);
                std::swap(obs_weight[ix], obs_weight[end_new]);
            }
        }

        ldouble_safe cumw = std::accumulate(obs_weight.begin(), obs_weight.begin() + end_new, (ldouble_safe)0);
        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(end_new);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&denseX](const size_t a, const size_t b){return denseX[a] < denseX[b];});
        ldouble_safe currw = 0;
        fill_val = denseX[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < end_new; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < end_new-1)
                    fill_val = denseX[sorted_ix[ix]] + (denseX[sorted_ix[ix+1]] - denseX[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = denseX[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * (coef / x_sd);
        denseX.clear();
        obs_weight.clear();
        sorted_ix.clear();
        
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, false);
    }

    else
    {
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, first_run);
    }
}